

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Extrapolater.cpp
# Opt level: O2

void amrex::Extrapolater::FirstOrderExtrap
               (MultiFab *mf,Geometry *geom,int scomp,int ncomp,int ngrow)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined8 *puVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  int iVar24;
  int *piVar25;
  double *pdVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  bool bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  Periodicity PVar48;
  Array4<double> local_6b0;
  int local_66c;
  long local_668;
  double *local_660;
  int local_658;
  uint local_654;
  Array4<const_int> local_650;
  long local_610;
  int local_604;
  int local_600;
  int local_5fc;
  long local_5f8;
  double *local_5f0;
  long local_5e8;
  long local_5e0;
  long local_5d8;
  int local_5cc;
  long local_5c8;
  long local_5c0;
  long local_5b8;
  long local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  undefined **local_590;
  long local_588;
  long local_580;
  long local_578;
  long local_570;
  long local_568;
  long local_560;
  long local_558;
  long local_550;
  long local_548;
  long local_540;
  ulong local_538;
  long local_530;
  long local_528;
  long local_520;
  long local_518;
  int local_50c;
  long local_508;
  long local_500;
  long local_4f8;
  long local_4f0;
  ulong local_4e8;
  double *local_4e0;
  double *local_4d8;
  double *local_4d0;
  double *local_4c8;
  double *local_4c0;
  long local_4b8;
  long local_4b0;
  int local_4a8;
  int local_4a4;
  FabArray<amrex::FArrayBox> *local_4a0;
  long local_498;
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  double *local_470;
  long local_468;
  long local_460;
  long local_458;
  long local_450;
  long local_448;
  ulong local_440;
  double *local_438;
  double *local_430;
  double *local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  double *local_408;
  double *local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  double *local_3e0;
  double *local_3d8;
  double *local_3d0;
  double *local_3c8;
  double *local_3c0;
  double *local_3b8;
  double *local_3b0;
  double *local_3a8;
  double *local_3a0;
  double *local_398;
  double *local_390;
  double *local_388;
  double *local_380;
  double *local_378;
  double *local_370;
  double *local_368;
  double *local_360;
  double *local_358;
  double *local_350;
  double *local_348;
  double *local_340;
  long local_338;
  double *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  double *local_300;
  double *local_2f8;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  double *local_288;
  double *local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  ulong local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  Box local_22c;
  MFIter mfi;
  iMultiFab mask;
  
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = 0;
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ = 1;
  mfi.fabArray._0_4_ = 0;
  mfi.fabArray._4_4_ = 0;
  mfi.tile_size.vect[0] = 0;
  mfi.tile_size.vect[1] = 0;
  mfi.tile_size.vect[2] = 0;
  mfi.flags = '\0';
  mfi._29_3_ = 0;
  mfi.currentIndex = 0;
  mfi.beginIndex = 0;
  local_650.p = (int *)&PTR__FabFactory_006d9518;
  local_4a4 = scomp;
  local_4a0 = &mf->super_FabArray<amrex::FArrayBox>;
  iMultiFab::iMultiFab
            (&mask,&(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray,
             &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap,1,ngrow,
             (MFInfo *)&mfi,(FabFactory<amrex::IArrayBox> *)&local_650);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi.tile_size);
  PVar48 = Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_1_ =
       (undefined1)PVar48.period.vect[0];
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._1_7_ = PVar48.period.vect._1_7_;
  mfi.fabArray._0_4_ = PVar48.period.vect[2];
  FabArray<amrex::IArrayBox>::BuildMask<amrex::IArrayBox,_0>
            (&mask.super_FabArray<amrex::IArrayBox>,&geom->domain,(Periodicity *)&mfi,1,0,0,1);
  local_258 = (ulong)(uint)ncomp;
  if (ncomp < 1) {
    local_258 = 0;
  }
  if (ngrow < 1) {
    ngrow = 0;
  }
  local_4e8 = 0xffffffffffffffff;
  uVar7 = 0;
  uVar37 = 0;
  local_50c = 1;
  local_4a8 = ngrow;
  do {
    if ((int)uVar7 == local_4a8) {
      iMultiFab::~iMultiFab(&mask);
      return;
    }
    MFIter::MFIter(&mfi,&local_4a0->super_FabArrayBase,'\0');
    local_538 = uVar37;
    local_440 = uVar7;
    while( true ) {
      iVar36 = (int)local_440;
      if (mfi.endIndex <= mfi.currentIndex) break;
      MFIter::validbox(&local_22c,&mfi);
      iVar5 = local_22c.bigend.vect[2];
      iVar4 = local_22c.bigend.vect[1];
      iVar3 = local_22c.bigend.vect[0];
      iVar2 = local_22c.smallend.vect[2];
      iVar8 = local_22c.smallend.vect[1];
      iVar29 = local_22c.smallend.vect[0];
      local_5cc = local_22c.smallend.vect[0] - iVar36;
      iVar34 = local_22c.smallend.vect[1] - iVar36;
      uVar32 = local_22c.smallend.vect[2] - iVar36;
      local_658 = local_22c.bigend.vect[0] + iVar36;
      local_66c = local_22c.bigend.vect[1] + iVar36;
      iVar18 = local_22c.bigend.vect[2] + iVar36;
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                (&local_650,&mask.super_FabArray<amrex::IArrayBox>,&mfi);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_6b0,local_4a0,&mfi,local_4a4);
      uVar37 = local_538;
      local_520 = (long)(int)uVar32 + -1;
      local_5c8 = (long)iVar18;
      local_5c0 = local_5c8 + 1;
      iVar24 = (int)local_520;
      iVar19 = (int)local_5c0;
      local_458 = (iVar24 - local_650.begin.z) * local_650.kstride;
      local_260 = (int)(uVar32 - local_650.begin.z) * local_650.kstride;
      local_460 = (iVar19 - local_650.begin.z) * local_650.kstride;
      local_5f8 = (iVar18 - local_650.begin.z) * local_650.kstride;
      lVar9 = (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride;
      lVar40 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
      lVar10 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
      lVar11 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
      local_528 = (long)iVar34 + -1;
      iVar27 = (int)local_528;
      local_5d8 = (long)local_66c;
      local_5e8 = local_5d8 + 1;
      iVar22 = (int)local_5e8;
      lVar14 = (iVar27 - local_650.begin.y) * local_650.jstride;
      local_478 = (iVar34 - local_650.begin.y) * local_650.jstride;
      lVar15 = (iVar22 - local_650.begin.y) * local_650.jstride;
      local_4b8 = (local_66c - local_650.begin.y) * local_650.jstride;
      lVar12 = (iVar34 - local_6b0.begin.y) * local_6b0.jstride;
      lVar28 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
      lVar23 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
      lVar38 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
      local_530 = (long)local_5cc + -1;
      iVar13 = (int)local_530;
      local_660 = (double *)CONCAT44(local_660._4_4_,iVar13 - local_650.begin.x);
      local_604 = iVar3 + iVar36 + 1;
      local_610 = CONCAT44(local_610._4_4_,local_604 - local_650.begin.x);
      local_5e0 = CONCAT44(local_5e0._4_4_,local_658 - local_650.begin.x);
      local_5b8 = (long)local_658;
      local_448 = (long)local_604;
      lVar30 = (long)(local_5cc - local_6b0.begin.x);
      lVar17 = (long)(local_658 - local_6b0.begin.x);
      lVar35 = (long)(iVar13 - local_6b0.begin.x);
      lVar16 = (long)(local_604 - local_6b0.begin.x);
      local_4c0 = local_6b0.p;
      local_5f0 = local_6b0.p + lVar38 + lVar35;
      local_400 = local_6b0.p + lVar12 + lVar30 + lVar9;
      local_340 = local_6b0.p + lVar12 + lVar30 + lVar40;
      local_408 = local_6b0.p + lVar12 + lVar30 + lVar10;
      local_348 = local_6b0.p + lVar12 + lVar30 + lVar11;
      local_350 = local_6b0.p + lVar28 + lVar30 + lVar9;
      local_290 = local_6b0.p + lVar28 + lVar30 + lVar40;
      local_358 = local_6b0.p + lVar28 + lVar30 + lVar10;
      local_298 = local_6b0.p + lVar28 + lVar30 + lVar11;
      local_360 = local_6b0.p + lVar12 + lVar35 + lVar9;
      local_2a0 = local_6b0.p + lVar12 + lVar35 + lVar40;
      local_368 = local_6b0.p + lVar12 + lVar35 + lVar10;
      local_2a8 = local_6b0.p + lVar12 + lVar35 + lVar11;
      local_280 = local_6b0.p + lVar28 + lVar35 + lVar40;
      local_2b0 = local_6b0.p + lVar28 + lVar35 + lVar9;
      local_288 = local_6b0.p + lVar28 + lVar35 + lVar11;
      local_2b8 = local_6b0.p + lVar28 + lVar35 + lVar10;
      local_410 = local_6b0.p + lVar23 + lVar30 + lVar9;
      local_370 = local_6b0.p + lVar23 + lVar30 + lVar40;
      local_418 = local_6b0.p + lVar23 + lVar30 + lVar10;
      local_378 = local_6b0.p + lVar23 + lVar30 + lVar11;
      local_380 = local_6b0.p + lVar38 + lVar30 + lVar9;
      local_2c0 = local_6b0.p + lVar38 + lVar30 + lVar40;
      local_388 = local_6b0.p + lVar38 + lVar30 + lVar10;
      local_2c8 = local_6b0.p + lVar38 + lVar30 + lVar11;
      local_390 = local_6b0.p + lVar23 + lVar35 + lVar9;
      local_2d0 = local_6b0.p + lVar23 + lVar35 + lVar40;
      local_398 = local_6b0.p + lVar23 + lVar35 + lVar10;
      local_2d8 = local_6b0.p + lVar23 + lVar35 + lVar11;
      local_4c8 = local_5f0 + lVar40;
      local_2e0 = local_5f0 + lVar9;
      local_4d0 = local_5f0 + lVar11;
      local_2e8 = local_5f0 + lVar10;
      local_420 = local_6b0.p + lVar17 + lVar12 + lVar10;
      local_428 = local_6b0.p + lVar16 + lVar28 + lVar11;
      local_430 = local_6b0.p + lVar12 + lVar17 + lVar9;
      local_3a0 = local_6b0.p + lVar12 + lVar17 + lVar40;
      local_3a8 = local_6b0.p + lVar12 + lVar17 + lVar11;
      local_3b0 = local_6b0.p + lVar28 + lVar17 + lVar9;
      local_2f0 = local_6b0.p + lVar28 + lVar17 + lVar40;
      local_3b8 = local_6b0.p + lVar28 + lVar17 + lVar10;
      local_2f8 = local_6b0.p + lVar28 + lVar17 + lVar11;
      local_3c0 = local_6b0.p + lVar12 + lVar16 + lVar9;
      local_300 = local_6b0.p + lVar12 + lVar16 + lVar40;
      local_3c8 = local_6b0.p + lVar12 + lVar16 + lVar10;
      local_308 = local_6b0.p + lVar12 + lVar16 + lVar11;
      local_470 = local_6b0.p + lVar28 + lVar16 + lVar11;
      local_310 = local_6b0.p + lVar28 + lVar16 + lVar10;
      local_4d8 = local_6b0.p + lVar28 + lVar16 + lVar40;
      local_318 = local_6b0.p + lVar28 + lVar16 + lVar9;
      local_438 = local_6b0.p + lVar23 + lVar17 + lVar9;
      local_3d0 = local_6b0.p + lVar23 + lVar17 + lVar40;
      local_3d8 = local_6b0.p + lVar38 + lVar17 + lVar9;
      local_320 = local_6b0.p + lVar38 + lVar17 + lVar40;
      local_4e0 = local_6b0.p + lVar38 + lVar16 + lVar40;
      local_328 = local_6b0.p + lVar23 + lVar16 + lVar40;
      local_3e0 = local_6b0.p + lVar23 + lVar16 + lVar9;
      local_330 = local_6b0.p + lVar38 + lVar16 + lVar9;
      lVar9 = (long)(iVar13 - local_650.begin.x);
      lVar10 = (long)(local_5cc - local_650.begin.x);
      local_268 = (long)local_650.p + lVar9 * 4 + lVar14 * 4;
      local_548 = (long)local_650.p + lVar9 * 4 + local_478 * 4;
      local_270 = (long)local_650.p + lVar9 * 4 + lVar15 * 4;
      local_550 = (long)local_650.p + lVar9 * 4 + local_4b8 * 4;
      local_500 = (long)local_650.p + lVar10 * 4 + lVar14 * 4;
      local_480 = (long)local_650.p + lVar10 * 4 + local_478 * 4;
      local_508 = (long)local_650.p + lVar10 * 4 + lVar15 * 4;
      local_488 = (long)local_650.p + lVar10 * 4 + local_4b8 * 4;
      lVar9 = (long)(local_604 - local_650.begin.x);
      local_3e8 = (long)(local_658 - local_650.begin.x);
      local_278 = (long)local_650.p + lVar9 * 4 + lVar14 * 4;
      local_540 = (long)local_650.p + local_3e8 * 4 + lVar14 * 4;
      iVar36 = (int)local_4e8;
      local_580 = (long)(iVar36 + iVar8);
      iVar6 = (int)local_538;
      local_4f8 = (long)(iVar6 + iVar2);
      local_5a0 = (long)(iVar8 + iVar6);
      local_5b0 = (long)(iVar6 + iVar29);
      local_3f0 = (long)local_650.p + local_478 * 4 + local_3e8 * 4;
      local_560 = (long)local_650.p + lVar9 * 4 + local_478 * 4;
      local_490 = (long)local_650.p + local_3e8 * 4 + local_478 * 4;
      local_3f8 = (long)local_650.p + local_458 * 4 + local_478 * 4;
      local_450 = (long)local_650.p + lVar9 * 4 + lVar15 * 4;
      local_558 = (long)local_650.p + local_3e8 * 4 + lVar15 * 4;
      local_568 = (long)local_650.p + lVar9 * 4 + local_4b8 * 4;
      local_498 = (long)local_650.p + local_3e8 * 4 + local_4b8 * 4;
      local_468 = (long)local_650.p + local_460 * 4 + lVar9 * 4;
      local_338 = (long)local_650.p + local_458 * 4 + lVar9 * 4;
      local_4b0 = (long)(iVar29 + iVar36);
      local_518 = (long)(iVar2 + iVar36);
      local_238 = (long)(iVar5 + local_50c);
      local_240 = (long)(iVar4 + local_50c);
      local_248 = (long)(iVar3 + local_50c);
      local_250 = local_248 * 8;
      local_248 = local_248 * 4;
      local_668 = local_6b0.nstride;
      local_4f0 = (long)iVar22;
      local_570 = local_4b0 * 8;
      local_578 = local_4b0 * 4;
      local_5a8 = 0;
      uVar7 = 0;
LAB_0048b026:
      lVar9 = local_580;
      if (uVar7 != local_258) {
        for (; lVar10 = local_580, (int)lVar9 <= iVar22; lVar9 = lVar9 + 1) {
          for (lVar10 = 0; local_4b0 + lVar10 <= local_448; lVar10 = lVar10 + 1) {
            if (*(int *)((long)local_650.p +
                        lVar10 * 4 +
                        (local_518 - local_650.begin.z) * local_650.kstride * 4 +
                        (lVar9 - local_650.begin.y) * local_650.jstride * 4 +
                        (long)local_650.begin.x * -4 + local_578) == 0) {
              *(undefined8 *)
               ((long)local_6b0.p +
               lVar10 * 8 +
               local_6b0.nstride * local_5a8 +
               (local_518 - local_6b0.begin.z) * local_6b0.kstride * 8 +
               (lVar9 - local_6b0.begin.y) * local_6b0.jstride * 8 + (long)local_6b0.begin.x * -8 +
               local_570) = 0;
            }
          }
        }
        for (; lVar9 = local_518, (int)lVar10 <= iVar22; lVar10 = lVar10 + 1) {
          for (lVar9 = 0; local_4b0 + lVar9 <= local_448; lVar9 = lVar9 + 1) {
            if (*(int *)((long)local_650.p +
                        lVar9 * 4 +
                        (local_238 - local_650.begin.z) * local_650.kstride * 4 +
                        (lVar10 - local_650.begin.y) * local_650.jstride * 4 +
                        (long)local_650.begin.x * -4 + local_578) == 0) {
              *(undefined8 *)
               ((long)local_6b0.p +
               lVar9 * 8 +
               local_6b0.nstride * local_5a8 +
               (local_238 - local_6b0.begin.z) * local_6b0.kstride * 8 +
               (lVar10 - local_6b0.begin.y) * local_6b0.jstride * 8 + (long)local_6b0.begin.x * -8 +
               local_570) = 0;
            }
          }
        }
        for (; lVar10 = local_518, (int)lVar9 <= iVar19; lVar9 = lVar9 + 1) {
          for (lVar10 = 0; local_4b0 + lVar10 <= local_448; lVar10 = lVar10 + 1) {
            if (*(int *)((long)local_650.p +
                        lVar10 * 4 +
                        (local_580 - local_650.begin.y) * local_650.jstride * 4 +
                        (lVar9 - local_650.begin.z) * local_650.kstride * 4 +
                        (long)local_650.begin.x * -4 + local_578) == 0) {
              *(undefined8 *)
               ((long)local_6b0.p +
               lVar10 * 8 +
               local_6b0.nstride * local_5a8 +
               (local_580 - local_6b0.begin.y) * local_6b0.jstride * 8 +
               (lVar9 - local_6b0.begin.z) * local_6b0.kstride * 8 + (long)local_6b0.begin.x * -8 +
               local_570) = 0;
            }
          }
        }
        for (; lVar9 = local_518, (int)lVar10 <= iVar19; lVar10 = lVar10 + 1) {
          for (lVar9 = 0; local_4b0 + lVar9 <= local_448; lVar9 = lVar9 + 1) {
            if (*(int *)((long)local_650.p +
                        lVar9 * 4 +
                        (local_240 - local_650.begin.y) * local_650.jstride * 4 +
                        (lVar10 - local_650.begin.z) * local_650.kstride * 4 +
                        (long)local_650.begin.x * -4 + local_578) == 0) {
              *(undefined8 *)
               ((long)local_6b0.p +
               lVar9 * 8 +
               local_6b0.nstride * local_5a8 +
               (local_240 - local_6b0.begin.y) * local_6b0.jstride * 8 +
               (lVar10 - local_6b0.begin.z) * local_6b0.kstride * 8 + (long)local_6b0.begin.x * -8 +
               local_570) = 0;
            }
          }
        }
        for (; lVar10 = local_518, (int)lVar9 <= iVar19; lVar9 = lVar9 + 1) {
          puVar20 = (undefined8 *)
                    ((long)local_6b0.p +
                    local_6b0.nstride * local_5a8 +
                    (local_580 - local_6b0.begin.y) * local_6b0.jstride * 8 +
                    (lVar9 - local_6b0.begin.z) * local_6b0.kstride * 8 +
                    (long)local_6b0.begin.x * -8 + local_570);
          piVar25 = (int *)((long)local_650.p +
                           (local_580 - local_650.begin.y) * local_650.jstride * 4 +
                           (lVar9 - local_650.begin.z) * local_650.kstride * 4 +
                           (long)local_650.begin.x * -4 + local_578);
          for (lVar10 = local_580; lVar10 <= local_4f0; lVar10 = lVar10 + 1) {
            if (*piVar25 == 0) {
              *puVar20 = 0;
            }
            puVar20 = puVar20 + local_6b0.jstride;
            piVar25 = piVar25 + local_650.jstride;
          }
        }
        for (; (int)lVar10 <= iVar19; lVar10 = lVar10 + 1) {
          puVar20 = (undefined8 *)
                    ((long)local_6b0.p +
                    local_6b0.nstride * local_5a8 +
                    (local_580 - local_6b0.begin.y) * local_6b0.jstride * 8 +
                    (lVar10 - local_6b0.begin.z) * local_6b0.kstride * 8 +
                    (long)local_6b0.begin.x * -8 + local_250);
          piVar25 = (int *)((long)local_650.p +
                           (local_580 - local_650.begin.y) * local_650.jstride * 4 +
                           (lVar10 - local_650.begin.z) * local_650.kstride * 4 +
                           (long)local_650.begin.x * -4 + local_248);
          for (lVar9 = local_580; lVar9 <= local_4f0; lVar9 = lVar9 + 1) {
            if (*piVar25 == 0) {
              *puVar20 = 0;
            }
            puVar20 = puVar20 + local_6b0.jstride;
            piVar25 = piVar25 + local_650.jstride;
          }
        }
        if (*(int *)(local_268 + local_458 * 4) == 0) {
          iVar36 = *(int *)(local_500 + local_458 * 4);
          iVar6 = *(int *)(local_548 + local_458 * 4);
          if (iVar36 == 1) {
            iVar29 = *(int *)(local_268 + local_260 * 4);
LAB_0048b6d4:
            dVar45 = (double)iVar36 * local_290[local_6b0.nstride * uVar7] +
                     (double)iVar6 * local_2a0[local_6b0.nstride * uVar7];
            pdVar26 = local_2b0;
LAB_0048b716:
            dVar45 = ((double)iVar29 * pdVar26[local_6b0.nstride * uVar7] + dVar45) /
                     (double)(iVar6 + iVar36 + iVar29);
          }
          else {
            iVar29 = *(int *)(local_268 + local_260 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048b6d4;
            iVar36 = *(int *)(local_480 + local_458 * 4);
            iVar6 = *(int *)(local_500 + local_260 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_548 + local_260 * 4);
LAB_0048f699:
              dVar45 = (double)iVar36 * local_340[local_6b0.nstride * uVar7] +
                       (double)iVar6 * local_350[local_6b0.nstride * uVar7];
              pdVar26 = local_360;
              goto LAB_0048b716;
            }
            iVar29 = *(int *)(local_548 + local_260 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048f699;
            dVar45 = local_400[local_6b0.nstride * uVar7];
          }
          local_280[local_6b0.nstride * uVar7] = dVar45;
        }
        if (*(int *)(local_268 + local_460 * 4) == 0) {
          iVar36 = *(int *)(local_500 + local_460 * 4);
          iVar6 = *(int *)(local_548 + local_460 * 4);
          if (iVar36 == 1) {
            iVar29 = *(int *)(local_268 + local_5f8 * 4);
LAB_0048b78c:
            dVar45 = (double)iVar36 * local_298[local_6b0.nstride * uVar7] +
                     (double)iVar6 * local_2a8[local_6b0.nstride * uVar7];
            pdVar26 = local_2b8;
LAB_0048b7ce:
            dVar45 = ((double)iVar29 * pdVar26[local_6b0.nstride * uVar7] + dVar45) /
                     (double)(iVar6 + iVar36 + iVar29);
          }
          else {
            iVar29 = *(int *)(local_268 + local_5f8 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048b78c;
            iVar36 = *(int *)(local_480 + local_460 * 4);
            iVar6 = *(int *)(local_500 + local_5f8 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_548 + local_5f8 * 4);
LAB_0048f6fc:
              dVar45 = (double)iVar36 * local_348[local_6b0.nstride * uVar7] +
                       (double)iVar6 * local_358[local_6b0.nstride * uVar7];
              pdVar26 = local_368;
              goto LAB_0048b7ce;
            }
            iVar29 = *(int *)(local_548 + local_5f8 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048f6fc;
            dVar45 = local_408[local_6b0.nstride * uVar7];
          }
          local_288[local_6b0.nstride * uVar7] = dVar45;
        }
        if (*(int *)(local_270 + local_458 * 4) == 0) {
          iVar36 = *(int *)(local_508 + local_458 * 4);
          iVar6 = *(int *)(local_550 + local_458 * 4);
          if (iVar36 == 1) {
            iVar29 = *(int *)(local_270 + local_260 * 4);
LAB_0048b834:
            dVar46 = (double)iVar6 * local_2d0[local_6b0.nstride * uVar7];
            dVar45 = (double)iVar36 * local_2c0[local_6b0.nstride * uVar7];
            pdVar26 = local_2e0;
          }
          else {
            iVar29 = *(int *)(local_270 + local_260 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048b834;
            iVar36 = *(int *)(local_488 + local_458 * 4);
            iVar6 = *(int *)(local_508 + local_260 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_550 + local_260 * 4);
            }
            else {
              iVar29 = *(int *)(local_550 + local_260 * 4);
              if ((iVar6 != 1) && (bVar44 = iVar29 != 1, iVar29 = 1, bVar44)) {
                local_4c8[local_6b0.nstride * uVar7] = local_410[local_6b0.nstride * uVar7];
                goto LAB_0048b899;
              }
            }
            dVar46 = (double)iVar6 * local_380[local_6b0.nstride * uVar7];
            dVar45 = (double)iVar36 * local_370[local_6b0.nstride * uVar7];
            pdVar26 = local_390;
          }
          local_4c8[local_6b0.nstride * uVar7] =
               ((double)iVar29 * pdVar26[local_6b0.nstride * uVar7] + dVar45 + dVar46) /
               (double)(iVar6 + iVar36 + iVar29);
        }
LAB_0048b899:
        if (*(int *)(local_270 + local_460 * 4) == 0) {
          iVar36 = *(int *)(local_508 + local_460 * 4);
          iVar6 = *(int *)(local_550 + local_460 * 4);
          if (iVar36 == 1) {
            iVar29 = *(int *)(local_270 + local_5f8 * 4);
LAB_0048b8e4:
            dVar46 = (double)iVar6 * local_2d8[local_6b0.nstride * uVar7];
            dVar45 = (double)iVar36 * local_2c8[local_6b0.nstride * uVar7];
            pdVar26 = local_2e8;
          }
          else {
            iVar29 = *(int *)(local_270 + local_5f8 * 4);
            if ((iVar6 == 1) || (bVar44 = iVar29 == 1, iVar29 = 1, bVar44)) goto LAB_0048b8e4;
            iVar36 = *(int *)(local_488 + local_460 * 4);
            iVar6 = *(int *)(local_508 + local_5f8 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_550 + local_5f8 * 4);
            }
            else {
              iVar29 = *(int *)(local_550 + local_5f8 * 4);
              if ((iVar6 != 1) && (bVar44 = iVar29 != 1, iVar29 = 1, bVar44)) {
                local_4d0[local_6b0.nstride * uVar7] = local_418[local_6b0.nstride * uVar7];
                goto LAB_0048b949;
              }
            }
            dVar46 = (double)iVar6 * local_388[local_6b0.nstride * uVar7];
            dVar45 = (double)iVar36 * local_378[local_6b0.nstride * uVar7];
            pdVar26 = local_398;
          }
          local_4d0[local_6b0.nstride * uVar7] =
               ((double)iVar29 * pdVar26[local_6b0.nstride * uVar7] + dVar45 + dVar46) /
               (double)(iVar6 + iVar36 + iVar29);
        }
LAB_0048b949:
        if (*(int *)(local_278 + local_458 * 4) == 0) {
          iVar36 = *(int *)(local_540 + local_458 * 4);
          iVar6 = *(int *)(local_560 + local_458 * 4);
          if (iVar36 == 1) {
            iVar29 = *(int *)(local_278 + local_260 * 4);
          }
          else {
            iVar29 = *(int *)(local_278 + local_260 * 4);
            if ((iVar6 != 1) && (bVar44 = iVar29 != 1, iVar29 = 1, bVar44)) {
              if ((*(int *)(local_490 + local_458 * 4) == 1) ||
                 ((*(int *)(local_540 + local_260 * 4) == 1 ||
                  (*(int *)(local_560 + local_260 * 4) == 1)))) {
                iVar36 = *(int *)(local_540 + local_260 * 4);
                iVar6 = *(int *)(local_560 + local_260 * 4);
                lVar9 = local_6b0.nstride * uVar7;
                local_4d8[lVar9] =
                     ((double)iVar6 * local_3c0[lVar9] +
                     (double)*(int *)(local_3f0 + local_458 * 4) * local_3a0[lVar9] +
                     (double)iVar36 * local_3b0[lVar9]) /
                     (double)(iVar6 + iVar36 + *(int *)(local_3f8 + local_3e8 * 4));
              }
              else {
                local_4d8[local_6b0.nstride * uVar7] = local_430[local_6b0.nstride * uVar7];
              }
              goto LAB_0048b9f9;
            }
          }
          lVar9 = local_6b0.nstride * uVar7;
          local_4d8[lVar9] =
               ((double)iVar29 * local_318[lVar9] +
               (double)iVar36 * local_2f0[lVar9] + (double)iVar6 * local_300[lVar9]) /
               (double)(iVar6 + iVar36 + iVar29);
        }
LAB_0048b9f9:
        if (*(int *)(local_278 + local_460 * 4) == 0) {
          iVar36 = *(int *)(local_540 + local_460 * 4);
          if (((iVar36 == 1) || (*(int *)(local_560 + local_460 * 4) == 1)) ||
             (*(int *)(local_278 + local_5f8 * 4) == 1)) {
            lVar9 = local_6b0.nstride * uVar7;
            iVar6 = *(int *)(local_468 + local_478 * 4);
            iVar29 = *(int *)(local_278 + local_5f8 * 4);
            local_470[lVar9] =
                 ((double)iVar29 * local_310[lVar9] +
                 (double)iVar36 * local_2f8[lVar9] + (double)iVar6 * local_308[lVar9]) /
                 (double)(iVar6 + iVar36 + iVar29);
          }
          else {
            iVar36 = *(int *)(local_490 + local_460 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_540 + local_5f8 * 4);
            }
            else {
              iVar6 = *(int *)(local_540 + local_5f8 * 4);
              iVar29 = 1;
              if ((iVar6 != 1) && (iVar29 = iVar6, *(int *)(local_560 + local_5f8 * 4) != 1)) {
                local_428[local_6b0.nstride * uVar7] = local_420[local_6b0.nstride * uVar7];
                goto LAB_0048bab9;
              }
            }
            lVar9 = local_6b0.nstride * uVar7;
            iVar6 = *(int *)(local_560 + local_5f8 * 4);
            local_470[lVar9] =
                 ((double)iVar6 * local_3c8[lVar9] +
                 (double)iVar36 * local_3a8[lVar9] + (double)iVar29 * local_3b8[lVar9]) /
                 (double)(iVar29 + iVar36 + iVar6);
          }
        }
LAB_0048bab9:
        if (*(int *)(local_450 + local_458 * 4) == 0) {
          iVar36 = *(int *)(local_558 + local_458 * 4);
          if (((iVar36 == 1) || (*(int *)(local_568 + local_458 * 4) == 1)) ||
             (*(int *)(local_450 + local_260 * 4) == 1)) {
            lVar9 = local_6b0.nstride * uVar7;
            iVar6 = *(int *)(local_338 + local_4b8 * 4);
            iVar29 = *(int *)(local_450 + local_260 * 4);
            local_4e0[lVar9] =
                 ((double)iVar29 * local_330[lVar9] +
                 (double)iVar36 * local_320[lVar9] + (double)iVar6 * local_328[lVar9]) /
                 (double)(iVar6 + iVar36 + iVar29);
          }
          else {
            iVar36 = *(int *)(local_498 + local_458 * 4);
            if (iVar36 == 1) {
              iVar29 = *(int *)(local_558 + local_260 * 4);
            }
            else {
              iVar6 = *(int *)(local_558 + local_260 * 4);
              iVar29 = 1;
              if ((iVar6 != 1) && (iVar29 = iVar6, *(int *)(local_568 + local_260 * 4) != 1)) {
                local_4e0[local_6b0.nstride * uVar7] = local_438[local_6b0.nstride * uVar7];
                goto LAB_0048bb68;
              }
            }
            lVar9 = local_6b0.nstride * uVar7;
            iVar6 = *(int *)(local_568 + local_260 * 4);
            local_4e0[lVar9] =
                 ((double)iVar6 * local_3e0[lVar9] +
                 (double)iVar36 * local_3d0[lVar9] + (double)iVar29 * local_3d8[lVar9]) /
                 (double)(iVar29 + iVar36 + iVar6);
          }
        }
LAB_0048bb68:
        if (*(int *)(local_450 + local_460 * 4) == 0) {
          iVar36 = *(int *)(local_558 + local_460 * 4);
          if (((iVar36 == 1) || (*(int *)(local_568 + local_460 * 4) == 1)) ||
             (*(int *)(local_450 + local_5f8 * 4) == 1)) {
            lVar9 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
            lVar10 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
            lVar11 = local_6b0.nstride * uVar7;
            iVar6 = *(int *)(local_468 + local_4b8 * 4);
            lVar12 = (long)(local_604 - local_6b0.begin.x);
            dVar45 = (double)iVar6 *
                     local_6b0.p
                     [(local_66c - local_6b0.begin.y) * local_6b0.jstride + lVar12 + lVar10 + lVar11
                     ];
            dVar46 = (double)iVar36 *
                     local_6b0.p[lVar9 + (long)(local_658 - local_6b0.begin.x) + lVar10 + lVar11];
            iVar29 = *(int *)(local_450 + local_5f8 * 4);
            dVar47 = (double)iVar29 *
                     local_6b0.p
                     [lVar9 + lVar12 + (iVar18 - local_6b0.begin.z) * local_6b0.kstride + lVar11];
            iVar29 = iVar6 + iVar36 + iVar29;
            lVar9 = lVar9 + lVar12 + lVar10;
          }
          else {
            iVar36 = *(int *)(local_498 + local_460 * 4);
            if (iVar36 == 1) {
              iVar8 = *(int *)(local_558 + local_5f8 * 4);
            }
            else {
              iVar6 = *(int *)(local_558 + local_5f8 * 4);
              iVar8 = 1;
              if ((iVar6 != 1) && (iVar8 = iVar6, *(int *)(local_568 + local_5f8 * 4) != 1)) {
                local_6b0.p
                [(iVar22 - local_6b0.begin.y) * local_6b0.jstride +
                 (long)(local_604 - local_6b0.begin.x) +
                 (iVar19 - local_6b0.begin.z) * local_6b0.kstride + local_6b0.nstride * uVar7] =
                     local_6b0.p
                     [(local_66c - local_6b0.begin.y) * local_6b0.jstride +
                      (long)(local_658 - local_6b0.begin.x) +
                      (iVar18 - local_6b0.begin.z) * local_6b0.kstride + local_6b0.nstride * uVar7];
                goto LAB_0048bcc3;
              }
            }
            lVar11 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
            lVar10 = local_6b0.nstride * uVar7;
            lVar9 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
            lVar14 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
            dVar45 = (double)iVar8 *
                     local_6b0.p[lVar9 + (long)(local_658 - local_6b0.begin.x) + lVar14 + lVar10];
            lVar12 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
            dVar46 = (double)iVar36 *
                     local_6b0.p[lVar11 + (long)(local_658 - local_6b0.begin.x) + lVar12 + lVar10];
            iVar29 = *(int *)(local_568 + local_5f8 * 4);
            dVar47 = (double)iVar29 *
                     local_6b0.p[lVar11 + (long)(local_604 - local_6b0.begin.x) + lVar14 + lVar10];
            iVar29 = iVar8 + iVar36 + iVar29;
            lVar9 = lVar9 + (local_604 - local_6b0.begin.x) + lVar12;
          }
          (local_6b0.p + lVar9)[local_6b0.nstride * uVar7] =
               (dVar47 + dVar46 + dVar45) / (double)iVar29;
        }
LAB_0048bcc3:
        lVar10 = (iVar27 - local_650.begin.y) * local_650.jstride;
        lVar14 = (long)local_650.begin.z;
        lVar9 = (long)(iVar13 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar10 = (long)(local_5cc - local_650.begin.x) * 4 + lVar10 * 4;
        lVar11 = (long)(iVar13 - local_650.begin.x) * 4 +
                 (iVar34 - local_650.begin.y) * local_650.jstride * 4;
        lVar23 = (long)(local_5cc - local_6b0.begin.x);
        lVar30 = (iVar34 - local_6b0.begin.y) * local_6b0.jstride;
        lVar28 = (long)local_6b0.begin.z;
        lVar15 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
        lVar16 = (long)(iVar13 - local_6b0.begin.x);
        lVar17 = local_6b0.nstride * uVar7;
        lVar12 = local_4f8;
        while (lVar12 <= local_5c8) {
          lVar35 = (lVar12 - lVar14) * local_650.kstride;
          if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 0) {
            iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
            iVar6 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
            iVar29 = iVar6;
            if ((iVar36 == 1) || (iVar29 = 1, iVar6 == 1)) {
LAB_0048be3a:
              lVar38 = (lVar12 - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p +
                              ((lVar12 + -1) - lVar14) * local_650.kstride * 4 + lVar9);
              lVar35 = lVar12 + 1;
              iVar8 = *(int *)((long)local_650.p + (lVar35 - lVar14) * local_650.kstride * 4 + lVar9
                              );
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar38] =
                   ((double)iVar8 *
                    local_6b0.p[lVar15 + lVar16 + lVar17 + (lVar35 - lVar28) * local_6b0.kstride] +
                   (double)iVar6 *
                   local_6b0.p
                   [lVar15 + lVar16 + lVar17 + ((lVar12 + -1) - lVar28) * local_6b0.kstride] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar38] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar38]) /
                   (double)(iVar29 + iVar36 + iVar6 + iVar8);
              lVar12 = lVar35;
            }
            else {
              lVar35 = ((lVar12 + -1) - lVar14) * local_650.kstride;
              iVar29 = iVar6;
              if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 1) goto LAB_0048be3a;
              lVar38 = lVar12 + 1;
              lVar40 = (lVar38 - lVar14) * local_650.kstride;
              if (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1) goto LAB_0048be3a;
              iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
              lVar31 = ((lVar12 + -1) - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p + lVar40 * 4 + lVar10);
              iVar29 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
              lVar35 = (lVar38 - lVar28) * local_6b0.kstride;
              iVar8 = *(int *)((long)local_650.p + lVar40 * 4 + lVar11);
              lVar12 = (lVar12 - lVar28) * local_6b0.kstride;
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar12] =
                   ((double)iVar8 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar35] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar31] +
                   (double)iVar6 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar35] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar31] +
                   local_6b0.p[lVar30 + lVar23 + lVar17 + lVar12]) /
                   (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
              lVar12 = lVar38;
            }
          }
          else {
            lVar12 = lVar12 + 1;
          }
        }
        lVar10 = (iVar22 - local_650.begin.y) * local_650.jstride;
        lVar14 = (long)local_650.begin.z;
        lVar9 = (long)(iVar13 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar10 = (long)(local_5cc - local_650.begin.x) * 4 + lVar10 * 4;
        lVar11 = (long)(iVar13 - local_650.begin.x) * 4 +
                 (local_66c - local_650.begin.y) * local_650.jstride * 4;
        lVar23 = (long)(local_5cc - local_6b0.begin.x);
        lVar30 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
        lVar28 = (long)local_6b0.begin.z;
        lVar15 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
        lVar16 = (long)(iVar13 - local_6b0.begin.x);
        lVar17 = local_6b0.nstride * uVar7;
        lVar12 = local_4f8;
        while (lVar12 <= local_5c8) {
          lVar35 = (lVar12 - lVar14) * local_650.kstride;
          if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 0) {
            iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
            iVar6 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
            iVar29 = iVar6;
            if ((iVar36 == 1) || (iVar29 = 1, iVar6 == 1)) {
LAB_0048c10d:
              lVar38 = (lVar12 - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p +
                              ((lVar12 + -1) - lVar14) * local_650.kstride * 4 + lVar9);
              lVar35 = lVar12 + 1;
              iVar8 = *(int *)((long)local_650.p + (lVar35 - lVar14) * local_650.kstride * 4 + lVar9
                              );
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar38] =
                   ((double)iVar8 *
                    local_6b0.p[lVar15 + lVar16 + lVar17 + (lVar35 - lVar28) * local_6b0.kstride] +
                   (double)iVar6 *
                   local_6b0.p
                   [lVar15 + lVar16 + lVar17 + ((lVar12 + -1) - lVar28) * local_6b0.kstride] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar38] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar38]) /
                   (double)(iVar29 + iVar36 + iVar6 + iVar8);
              lVar12 = lVar35;
            }
            else {
              lVar35 = ((lVar12 + -1) - lVar14) * local_650.kstride;
              iVar29 = iVar6;
              if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 1) goto LAB_0048c10d;
              lVar38 = lVar12 + 1;
              lVar40 = (lVar38 - lVar14) * local_650.kstride;
              if (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1) goto LAB_0048c10d;
              iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
              lVar31 = ((lVar12 + -1) - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p + lVar40 * 4 + lVar10);
              iVar29 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
              lVar35 = (lVar38 - lVar28) * local_6b0.kstride;
              iVar8 = *(int *)((long)local_650.p + lVar40 * 4 + lVar11);
              lVar12 = (lVar12 - lVar28) * local_6b0.kstride;
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar12] =
                   ((double)iVar8 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar35] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar31] +
                   (double)iVar6 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar35] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar31] +
                   local_6b0.p[lVar30 + lVar23 + lVar17 + lVar12]) /
                   (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
              lVar12 = lVar38;
            }
          }
          else {
            lVar12 = lVar12 + 1;
          }
        }
        lVar10 = (iVar27 - local_650.begin.y) * local_650.jstride;
        lVar14 = (long)local_650.begin.z;
        lVar9 = (long)(local_604 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar10 = (long)(local_658 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar11 = (long)(local_604 - local_650.begin.x) * 4 +
                 (iVar34 - local_650.begin.y) * local_650.jstride * 4;
        lVar23 = (long)(local_658 - local_6b0.begin.x);
        lVar30 = (iVar34 - local_6b0.begin.y) * local_6b0.jstride;
        lVar28 = (long)local_6b0.begin.z;
        lVar15 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
        lVar16 = (long)(local_604 - local_6b0.begin.x);
        lVar17 = local_6b0.nstride * uVar7;
        lVar12 = local_4f8;
        while (lVar12 <= local_5c8) {
          lVar35 = (lVar12 - lVar14) * local_650.kstride;
          if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 0) {
            iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
            iVar6 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
            iVar29 = iVar6;
            if ((iVar36 == 1) || (iVar29 = 1, iVar6 == 1)) {
LAB_0048c3f0:
              lVar38 = (lVar12 - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p +
                              ((lVar12 + -1) - lVar14) * local_650.kstride * 4 + lVar9);
              lVar35 = lVar12 + 1;
              iVar8 = *(int *)((long)local_650.p + (lVar35 - lVar14) * local_650.kstride * 4 + lVar9
                              );
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar38] =
                   ((double)iVar8 *
                    local_6b0.p[lVar15 + lVar16 + lVar17 + (lVar35 - lVar28) * local_6b0.kstride] +
                   (double)iVar6 *
                   local_6b0.p
                   [lVar15 + lVar16 + lVar17 + ((lVar12 + -1) - lVar28) * local_6b0.kstride] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar38] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar38]) /
                   (double)(iVar29 + iVar36 + iVar6 + iVar8);
              lVar12 = lVar35;
            }
            else {
              lVar35 = ((lVar12 + -1) - lVar14) * local_650.kstride;
              iVar29 = iVar6;
              if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 1) goto LAB_0048c3f0;
              lVar38 = lVar12 + 1;
              lVar40 = (lVar38 - lVar14) * local_650.kstride;
              if (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1) goto LAB_0048c3f0;
              iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
              lVar31 = ((lVar12 + -1) - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p + lVar40 * 4 + lVar10);
              iVar29 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
              lVar35 = (lVar38 - lVar28) * local_6b0.kstride;
              iVar8 = *(int *)((long)local_650.p + lVar40 * 4 + lVar11);
              lVar12 = (lVar12 - lVar28) * local_6b0.kstride;
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar12] =
                   ((double)iVar8 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar35] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar31] +
                   (double)iVar6 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar35] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar31] +
                   local_6b0.p[lVar30 + lVar23 + lVar17 + lVar12]) /
                   (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
              lVar12 = lVar38;
            }
          }
          else {
            lVar12 = lVar12 + 1;
          }
        }
        lVar10 = (iVar22 - local_650.begin.y) * local_650.jstride;
        lVar14 = (long)local_650.begin.z;
        lVar9 = (long)(local_604 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar10 = (long)(local_658 - local_650.begin.x) * 4 + lVar10 * 4;
        lVar11 = (long)(local_604 - local_650.begin.x) * 4 +
                 (local_66c - local_650.begin.y) * local_650.jstride * 4;
        lVar23 = (long)(local_658 - local_6b0.begin.x);
        lVar30 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
        lVar28 = (long)local_6b0.begin.z;
        lVar15 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
        lVar16 = (long)(local_604 - local_6b0.begin.x);
        lVar17 = local_6b0.nstride * uVar7;
        lVar12 = local_4f8;
        while (lVar12 <= local_5c8) {
          lVar35 = (lVar12 - lVar14) * local_650.kstride;
          if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 0) {
            iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
            iVar6 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
            iVar29 = iVar6;
            if ((iVar36 == 1) || (iVar29 = 1, iVar6 == 1)) {
LAB_0048c6d3:
              lVar38 = (lVar12 - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p +
                              ((lVar12 + -1) - lVar14) * local_650.kstride * 4 + lVar9);
              lVar35 = lVar12 + 1;
              iVar8 = *(int *)((long)local_650.p + (lVar35 - lVar14) * local_650.kstride * 4 + lVar9
                              );
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar38] =
                   ((double)iVar8 *
                    local_6b0.p[lVar15 + lVar16 + lVar17 + (lVar35 - lVar28) * local_6b0.kstride] +
                   (double)iVar6 *
                   local_6b0.p
                   [lVar15 + lVar16 + lVar17 + ((lVar12 + -1) - lVar28) * local_6b0.kstride] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar38] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar38]) /
                   (double)(iVar29 + iVar36 + iVar6 + iVar8);
              lVar12 = lVar35;
            }
            else {
              lVar35 = ((lVar12 + -1) - lVar14) * local_650.kstride;
              iVar29 = iVar6;
              if (*(int *)((long)local_650.p + lVar35 * 4 + lVar9) == 1) goto LAB_0048c6d3;
              lVar38 = lVar12 + 1;
              lVar40 = (lVar38 - lVar14) * local_650.kstride;
              if (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1) goto LAB_0048c6d3;
              iVar36 = *(int *)((long)local_650.p + lVar35 * 4 + lVar10);
              lVar31 = ((lVar12 + -1) - lVar28) * local_6b0.kstride;
              iVar6 = *(int *)((long)local_650.p + lVar40 * 4 + lVar10);
              iVar29 = *(int *)((long)local_650.p + lVar35 * 4 + lVar11);
              lVar35 = (lVar38 - lVar28) * local_6b0.kstride;
              iVar8 = *(int *)((long)local_650.p + lVar40 * 4 + lVar11);
              lVar12 = (lVar12 - lVar28) * local_6b0.kstride;
              local_6b0.p[lVar15 + lVar16 + lVar17 + lVar12] =
                   ((double)iVar8 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar35] +
                   (double)iVar29 * local_6b0.p[lVar30 + lVar16 + lVar17 + lVar31] +
                   (double)iVar6 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar35] +
                   (double)iVar36 * local_6b0.p[lVar15 + lVar23 + lVar17 + lVar31] +
                   local_6b0.p[lVar30 + lVar23 + lVar17 + lVar12]) /
                   (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
              lVar12 = lVar38;
            }
          }
          else {
            lVar12 = lVar12 + 1;
          }
        }
        lVar38 = (long)(iVar13 - local_650.begin.x);
        lVar11 = (long)local_650.begin.y;
        lVar12 = (iVar24 - local_650.begin.z) * local_650.kstride;
        lVar14 = (long)(local_5cc - local_650.begin.x);
        lVar15 = (int)(uVar32 - local_650.begin.z) * local_650.kstride;
        lVar23 = (long)(local_5cc - local_6b0.begin.x);
        lVar17 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
        lVar35 = local_6b0.nstride * uVar7;
        lVar28 = (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride;
        lVar30 = (long)(iVar13 - local_6b0.begin.x);
        lVar9 = lVar12 * 4 + lVar38 * 4;
        lVar16 = (long)local_6b0.begin.y;
        lVar10 = local_5a0;
LAB_0048c990:
        do {
          if (local_5d8 < lVar10) goto LAB_0048cc66;
          lVar31 = (lVar10 - lVar11) * local_650.jstride;
          lVar40 = lVar38 * 4 + lVar31 * 4;
          if (*(int *)((long)local_650.p + lVar12 * 4 + lVar40) != 0) {
            lVar10 = lVar10 + 1;
            goto LAB_0048c990;
          }
          iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar31 * 4);
          lVar31 = lVar10 + -1;
          lVar21 = (lVar31 - lVar11) * local_650.jstride;
          if (iVar36 != 1) {
            lVar42 = lVar38 * 4 + lVar21 * 4;
            if (*(int *)((long)local_650.p + lVar12 * 4 + lVar42) != 1) {
              lVar43 = lVar10 + 1;
              lVar41 = (lVar43 - lVar11) * local_650.jstride;
              lVar1 = (long)local_650.p + lVar38 * 4 + lVar41 * 4;
              if ((*(int *)(lVar1 + lVar12 * 4) != 1) &&
                 (*(int *)((long)local_650.p + lVar15 * 4 + lVar40) != 1)) {
                iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar21 * 4);
                lVar31 = (lVar31 - lVar16) * local_6b0.jstride;
                local_600 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar41 * 4);
                lVar40 = (lVar43 - lVar16) * local_6b0.jstride;
                lVar10 = (lVar10 - lVar16) * local_6b0.jstride;
                iVar6 = *(int *)((long)local_650.p + lVar15 * 4 + lVar42);
                iVar29 = *(int *)(lVar1 + lVar15 * 4);
                local_6b0.p[lVar10 + lVar30 + lVar17 + lVar35] =
                     ((double)iVar29 * local_6b0.p[lVar40 + lVar30 + lVar28 + lVar35] +
                     (double)iVar6 * local_6b0.p[lVar31 + lVar30 + lVar28 + lVar35] +
                     (double)iVar36 * local_6b0.p[lVar31 + lVar23 + lVar17 + lVar35] +
                     (double)local_600 * local_6b0.p[lVar40 + lVar23 + lVar17 + lVar35] +
                     local_6b0.p[lVar10 + lVar23 + lVar28 + lVar35]) /
                     (double)(iVar29 + iVar36 + local_600 + iVar6 + 1);
                lVar10 = lVar43;
                local_598 = lVar1;
                local_590 = (undefined **)local_650.p;
                goto LAB_0048c990;
              }
            }
          }
          lVar42 = (lVar10 - lVar16) * local_6b0.jstride;
          iVar6 = *(int *)((long)local_650.p + lVar21 * 4 + lVar9);
          iVar29 = *(int *)((long)local_650.p +
                           ((lVar10 - lVar11) + 1) * local_650.jstride * 4 + lVar9);
          iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar40);
          local_6b0.p[lVar42 + lVar30 + lVar17 + lVar35] =
               ((double)iVar8 * local_6b0.p[lVar42 + lVar30 + lVar28 + lVar35] +
               (double)iVar29 *
               local_6b0.p[lVar30 + lVar17 + lVar35 + ((lVar10 + 1) - lVar16) * local_6b0.jstride] +
               (double)iVar36 * local_6b0.p[lVar42 + lVar23 + lVar17 + lVar35] +
               (double)iVar6 *
               local_6b0.p[lVar30 + lVar17 + lVar35 + (lVar31 - lVar16) * local_6b0.jstride]) /
               (double)(iVar6 + iVar29 + iVar36 + iVar8);
          lVar10 = lVar10 + 1;
        } while( true );
      }
      local_654 = uVar32;
      local_5fc = iVar34;
      MFIter::operator++(&mfi);
    }
    MFIter::~MFIter(&mfi);
    uVar7 = (ulong)(iVar36 + 1);
    local_4e8 = (ulong)((int)local_4e8 - 1);
    uVar37 = (ulong)((int)uVar37 - 1);
    local_50c = local_50c + 1;
  } while( true );
LAB_0048cc66:
  lVar38 = (long)(iVar13 - local_650.begin.x);
  lVar11 = (long)local_650.begin.y;
  lVar12 = (iVar19 - local_650.begin.z) * local_650.kstride;
  lVar14 = (long)(local_5cc - local_650.begin.x);
  lVar15 = (iVar18 - local_650.begin.z) * local_650.kstride;
  lVar23 = (long)(local_5cc - local_6b0.begin.x);
  lVar17 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
  lVar35 = local_6b0.nstride * uVar7;
  lVar28 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
  lVar30 = (long)(iVar13 - local_6b0.begin.x);
  lVar9 = lVar12 * 4 + lVar38 * 4;
  lVar16 = (long)local_6b0.begin.y;
  lVar10 = local_5a0;
LAB_0048cdb3:
  do {
    if (local_5d8 < lVar10) break;
    lVar31 = (lVar10 - lVar11) * local_650.jstride;
    lVar40 = lVar38 * 4 + lVar31 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar40) != 0) {
      lVar10 = lVar10 + 1;
      goto LAB_0048cdb3;
    }
    iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar31 * 4);
    lVar31 = lVar10 + -1;
    lVar21 = (lVar31 - lVar11) * local_650.jstride;
    if (iVar36 != 1) {
      lVar42 = lVar38 * 4 + lVar21 * 4;
      if (*(int *)((long)local_650.p + lVar12 * 4 + lVar42) != 1) {
        lVar43 = lVar10 + 1;
        lVar41 = (lVar43 - lVar11) * local_650.jstride;
        lVar1 = (long)local_650.p + lVar38 * 4 + lVar41 * 4;
        if ((*(int *)(lVar1 + lVar12 * 4) != 1) &&
           (*(int *)((long)local_650.p + lVar15 * 4 + lVar40) != 1)) {
          iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar21 * 4);
          lVar31 = (lVar31 - lVar16) * local_6b0.jstride;
          local_600 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar41 * 4);
          lVar40 = (lVar43 - lVar16) * local_6b0.jstride;
          lVar10 = (lVar10 - lVar16) * local_6b0.jstride;
          iVar6 = *(int *)((long)local_650.p + lVar15 * 4 + lVar42);
          iVar29 = *(int *)(lVar1 + lVar15 * 4);
          local_6b0.p[lVar10 + lVar30 + lVar17 + lVar35] =
               ((double)iVar29 * local_6b0.p[lVar40 + lVar30 + lVar28 + lVar35] +
               (double)iVar6 * local_6b0.p[lVar31 + lVar30 + lVar28 + lVar35] +
               (double)iVar36 * local_6b0.p[lVar31 + lVar23 + lVar17 + lVar35] +
               (double)local_600 * local_6b0.p[lVar40 + lVar23 + lVar17 + lVar35] +
               local_6b0.p[lVar10 + lVar23 + lVar28 + lVar35]) /
               (double)(iVar29 + iVar36 + local_600 + iVar6 + 1);
          lVar10 = lVar43;
          local_598 = lVar1;
          local_590 = (undefined **)local_650.p;
          goto LAB_0048cdb3;
        }
      }
    }
    lVar42 = (lVar10 - lVar16) * local_6b0.jstride;
    iVar6 = *(int *)((long)local_650.p + lVar21 * 4 + lVar9);
    iVar29 = *(int *)((long)local_650.p + ((lVar10 - lVar11) + 1) * local_650.jstride * 4 + lVar9);
    iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar40);
    local_6b0.p[lVar42 + lVar30 + lVar17 + lVar35] =
         ((double)iVar8 * local_6b0.p[lVar42 + lVar30 + lVar28 + lVar35] +
         (double)iVar29 *
         local_6b0.p[lVar30 + lVar17 + lVar35 + ((lVar10 + 1) - lVar16) * local_6b0.jstride] +
         (double)iVar36 * local_6b0.p[lVar42 + lVar23 + lVar17 + lVar35] +
         (double)iVar6 *
         local_6b0.p[lVar30 + lVar17 + lVar35 + (lVar31 - lVar16) * local_6b0.jstride]) /
         (double)(iVar6 + iVar29 + iVar36 + iVar8);
    lVar10 = lVar10 + 1;
  } while( true );
  lVar38 = (long)(local_604 - local_650.begin.x);
  lVar11 = (long)local_650.begin.y;
  lVar12 = (iVar24 - local_650.begin.z) * local_650.kstride;
  lVar14 = (long)(local_658 - local_650.begin.x);
  lVar15 = (int)(uVar32 - local_650.begin.z) * local_650.kstride;
  lVar23 = (long)(local_658 - local_6b0.begin.x);
  lVar17 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
  lVar35 = local_6b0.nstride * uVar7;
  lVar28 = (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride;
  lVar30 = (long)(local_604 - local_6b0.begin.x);
  lVar9 = lVar12 * 4 + lVar38 * 4;
  lVar16 = (long)local_6b0.begin.y;
  lVar10 = local_5a0;
LAB_0048d1d5:
  do {
    if (local_5d8 < lVar10) break;
    lVar31 = (lVar10 - lVar11) * local_650.jstride;
    lVar40 = lVar38 * 4 + lVar31 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar40) != 0) {
      lVar10 = lVar10 + 1;
      goto LAB_0048d1d5;
    }
    iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar31 * 4);
    lVar31 = lVar10 + -1;
    lVar21 = (lVar31 - lVar11) * local_650.jstride;
    if (iVar36 != 1) {
      lVar42 = lVar38 * 4 + lVar21 * 4;
      if (*(int *)((long)local_650.p + lVar12 * 4 + lVar42) != 1) {
        lVar43 = lVar10 + 1;
        lVar41 = (lVar43 - lVar11) * local_650.jstride;
        lVar1 = (long)local_650.p + lVar38 * 4 + lVar41 * 4;
        if ((*(int *)(lVar1 + lVar12 * 4) != 1) &&
           (*(int *)((long)local_650.p + lVar15 * 4 + lVar40) != 1)) {
          iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar21 * 4);
          lVar31 = (lVar31 - lVar16) * local_6b0.jstride;
          local_600 = *(int *)((long)local_650.p + lVar12 * 4 + lVar14 * 4 + lVar41 * 4);
          lVar40 = (lVar43 - lVar16) * local_6b0.jstride;
          lVar10 = (lVar10 - lVar16) * local_6b0.jstride;
          iVar6 = *(int *)((long)local_650.p + lVar15 * 4 + lVar42);
          iVar29 = *(int *)(lVar1 + lVar15 * 4);
          local_6b0.p[lVar10 + lVar30 + lVar17 + lVar35] =
               ((double)iVar29 * local_6b0.p[lVar40 + lVar30 + lVar28 + lVar35] +
               (double)iVar6 * local_6b0.p[lVar31 + lVar30 + lVar28 + lVar35] +
               (double)iVar36 * local_6b0.p[lVar31 + lVar23 + lVar17 + lVar35] +
               (double)local_600 * local_6b0.p[lVar40 + lVar23 + lVar17 + lVar35] +
               local_6b0.p[lVar10 + lVar23 + lVar28 + lVar35]) /
               (double)(iVar29 + iVar36 + local_600 + iVar6 + 1);
          lVar10 = lVar43;
          local_598 = lVar1;
          local_590 = (undefined **)local_650.p;
          goto LAB_0048d1d5;
        }
      }
    }
    lVar42 = (lVar10 - lVar16) * local_6b0.jstride;
    iVar6 = *(int *)((long)local_650.p + lVar21 * 4 + lVar9);
    iVar29 = *(int *)((long)local_650.p + ((lVar10 - lVar11) + 1) * local_650.jstride * 4 + lVar9);
    iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar40);
    local_6b0.p[lVar42 + lVar30 + lVar17 + lVar35] =
         ((double)iVar8 * local_6b0.p[lVar42 + lVar30 + lVar28 + lVar35] +
         (double)iVar29 *
         local_6b0.p[lVar30 + lVar17 + lVar35 + ((lVar10 + 1) - lVar16) * local_6b0.jstride] +
         (double)iVar36 * local_6b0.p[lVar42 + lVar23 + lVar17 + lVar35] +
         (double)iVar6 *
         local_6b0.p[lVar30 + lVar17 + lVar35 + (lVar31 - lVar16) * local_6b0.jstride]) /
         (double)(iVar6 + iVar29 + iVar36 + iVar8);
    lVar10 = lVar10 + 1;
  } while( true );
  local_588 = (long)(local_604 - local_650.begin.x);
  lVar10 = (long)local_650.begin.y;
  lVar11 = (iVar19 - local_650.begin.z) * local_650.kstride;
  lVar12 = (long)(local_658 - local_650.begin.x);
  lVar14 = (iVar18 - local_650.begin.z) * local_650.kstride;
  lVar17 = (long)(local_658 - local_6b0.begin.x);
  lVar16 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
  lVar30 = local_6b0.nstride * uVar7;
  lVar23 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
  lVar28 = (long)(local_604 - local_6b0.begin.x);
  local_5e0 = (long)local_650.p + lVar11 * 4 + local_588 * 4;
  local_5f0 = local_6b0.p + lVar28 + lVar16 + lVar30;
  lVar15 = (long)local_6b0.begin.y;
  lVar9 = local_5a0;
LAB_0048d5f4:
  do {
    if (local_5d8 < lVar9) break;
    lVar38 = (lVar9 - lVar10) * local_650.jstride;
    lVar35 = local_588 * 4 + lVar38 * 4;
    if (*(int *)((long)local_650.p + lVar11 * 4 + lVar35) != 0) {
      lVar9 = lVar9 + 1;
      goto LAB_0048d5f4;
    }
    iVar36 = *(int *)((long)local_650.p + lVar11 * 4 + lVar12 * 4 + lVar38 * 4);
    lVar38 = lVar9 + -1;
    lVar40 = (lVar38 - lVar10) * local_650.jstride;
    if (iVar36 != 1) {
      lVar31 = local_588 * 4 + lVar40 * 4;
      if (*(int *)((long)local_650.p + lVar11 * 4 + lVar31) != 1) {
        lVar21 = lVar9 + 1;
        lVar43 = (lVar21 - lVar10) * local_650.jstride;
        lVar42 = (long)local_650.p + local_588 * 4 + lVar43 * 4;
        if ((*(int *)(lVar42 + lVar11 * 4) != 1) &&
           (*(int *)((long)local_650.p + lVar14 * 4 + lVar35) != 1)) {
          iVar36 = *(int *)((long)local_650.p + lVar11 * 4 + lVar12 * 4 + lVar40 * 4);
          lVar38 = (lVar38 - lVar15) * local_6b0.jstride;
          local_600 = *(int *)((long)local_650.p + lVar11 * 4 + lVar12 * 4 + lVar43 * 4);
          lVar35 = (lVar21 - lVar15) * local_6b0.jstride;
          lVar9 = (lVar9 - lVar15) * local_6b0.jstride;
          iVar6 = *(int *)((long)local_650.p + lVar14 * 4 + lVar31);
          iVar29 = *(int *)(lVar42 + lVar14 * 4);
          local_6b0.p[lVar9 + lVar28 + lVar16 + lVar30] =
               ((double)iVar29 * local_6b0.p[lVar35 + lVar28 + lVar23 + lVar30] +
               (double)iVar6 * local_6b0.p[lVar38 + lVar28 + lVar23 + lVar30] +
               (double)iVar36 * local_6b0.p[lVar38 + lVar17 + lVar16 + lVar30] +
               (double)local_600 * local_6b0.p[lVar35 + lVar17 + lVar16 + lVar30] +
               local_6b0.p[lVar9 + lVar17 + lVar23 + lVar30]) /
               (double)(iVar29 + iVar36 + local_600 + iVar6 + 1);
          lVar9 = lVar21;
          local_598 = lVar42;
          local_590 = (undefined **)local_650.p;
          goto LAB_0048d5f4;
        }
      }
    }
    lVar31 = (lVar9 - lVar15) * local_6b0.jstride;
    iVar6 = *(int *)(local_5e0 + lVar40 * 4);
    iVar29 = *(int *)(local_5e0 + ((lVar9 - lVar10) + 1) * local_650.jstride * 4);
    iVar8 = *(int *)((long)local_650.p + lVar14 * 4 + lVar35);
    local_6b0.p[lVar31 + lVar28 + lVar16 + lVar30] =
         ((double)iVar8 * local_6b0.p[lVar31 + lVar28 + lVar23 + lVar30] +
         (double)iVar29 * local_5f0[((lVar9 + 1) - lVar15) * local_6b0.jstride] +
         (double)iVar36 * local_6b0.p[lVar31 + lVar17 + lVar16 + lVar30] +
         (double)iVar6 * local_5f0[(lVar38 - lVar15) * local_6b0.jstride]) /
         (double)(iVar6 + iVar29 + iVar36 + iVar8);
    lVar9 = lVar9 + 1;
  } while( true );
  lVar11 = (long)local_650.begin.x;
  lVar14 = (iVar27 - local_650.begin.y) * local_650.jstride;
  lVar12 = (iVar24 - local_650.begin.z) * local_650.kstride;
  lVar9 = lVar12 * 4 + (iVar34 - local_650.begin.y) * local_650.jstride * 4;
  lVar17 = (int)(uVar32 - local_650.begin.z) * local_650.kstride;
  lVar30 = (long)local_6b0.begin.x;
  lVar16 = (iVar34 - local_6b0.begin.y) * local_6b0.jstride;
  lVar35 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
  lVar28 = local_6b0.nstride * uVar7;
  lVar15 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
  lVar23 = (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride;
  lVar10 = local_5b0;
  while (lVar10 <= local_5b8) {
    lVar40 = lVar10 - lVar11;
    lVar38 = lVar40 * 4 + lVar14 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar38) == 0) {
      lVar31 = lVar10 + -1;
      lVar42 = (lVar31 - lVar11) * 4 + lVar14 * 4;
      iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar42);
      lVar21 = lVar10 + 1;
      lVar43 = lVar21 - lVar11;
      if ((((iVar36 == 1) ||
           (lVar1 = lVar43 * 4 + lVar14 * 4, *(int *)((long)local_650.p + lVar12 * 4 + lVar1) == 1))
          || (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1)) ||
         (*(int *)((long)local_650.p + lVar17 * 4 + lVar38) == 1)) {
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar12 * 4 + lVar14 * 4);
        iVar29 = *(int *)((long)local_650.p + lVar40 * 4 + lVar9);
        lVar10 = lVar10 - lVar30;
        iVar8 = *(int *)((long)local_650.p + lVar17 * 4 + lVar38);
        local_6b0.p[lVar15 + lVar10 + lVar35 + lVar28] =
             ((double)iVar8 * local_6b0.p[lVar15 + lVar10 + lVar23 + lVar28] +
             (double)iVar29 * local_6b0.p[lVar16 + lVar35 + lVar28 + lVar10] +
             (double)iVar36 * local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar31 - lVar30)] +
             (double)iVar6 * local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar21 - lVar30)]) /
             (double)(iVar6 + iVar29 + iVar36 + iVar8);
        lVar10 = lVar21;
      }
      else {
        iVar36 = *(int *)((long)local_650.p + (lVar31 - lVar11) * 4 + lVar9);
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar9);
        iVar29 = *(int *)((long)local_650.p + lVar17 * 4 + lVar42);
        iVar8 = *(int *)((long)local_650.p + lVar17 * 4 + lVar1);
        local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar10 - lVar30)] =
             ((double)iVar8 * local_6b0.p[lVar15 + lVar23 + lVar28 + (lVar21 - lVar30)] +
              (double)iVar29 * local_6b0.p[lVar15 + lVar23 + lVar28 + (lVar31 - lVar30)] +
              (double)iVar36 * local_6b0.p[lVar16 + lVar35 + lVar28 + (lVar31 - lVar30)] +
              (double)iVar6 * local_6b0.p[lVar16 + lVar35 + lVar28 + (lVar21 - lVar30)] +
             local_6b0.p[lVar16 + lVar23 + lVar28 + (lVar10 - lVar30)]) /
             (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
        lVar10 = lVar21;
      }
    }
    else {
      lVar10 = lVar10 + 1;
    }
  }
  lVar11 = (long)local_650.begin.x;
  lVar14 = (iVar27 - local_650.begin.y) * local_650.jstride;
  lVar12 = (iVar19 - local_650.begin.z) * local_650.kstride;
  lVar9 = lVar12 * 4 + (iVar34 - local_650.begin.y) * local_650.jstride * 4;
  lVar17 = (iVar18 - local_650.begin.z) * local_650.kstride;
  lVar30 = (long)local_6b0.begin.x;
  lVar16 = (iVar34 - local_6b0.begin.y) * local_6b0.jstride;
  lVar35 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
  lVar28 = local_6b0.nstride * uVar7;
  lVar15 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
  lVar23 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
  lVar10 = local_5b0;
  while (lVar10 <= local_5b8) {
    lVar40 = lVar10 - lVar11;
    lVar38 = lVar40 * 4 + lVar14 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar38) == 0) {
      lVar31 = lVar10 + -1;
      lVar42 = (lVar31 - lVar11) * 4 + lVar14 * 4;
      iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar42);
      lVar21 = lVar10 + 1;
      lVar43 = lVar21 - lVar11;
      if (((iVar36 == 1) ||
          (lVar1 = lVar43 * 4 + lVar14 * 4, *(int *)((long)local_650.p + lVar12 * 4 + lVar1) == 1))
         || ((*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1 ||
             (*(int *)((long)local_650.p + lVar17 * 4 + lVar38) == 1)))) {
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar12 * 4 + lVar14 * 4);
        iVar29 = *(int *)((long)local_650.p + lVar40 * 4 + lVar9);
        lVar10 = lVar10 - lVar30;
        iVar8 = *(int *)((long)local_650.p + lVar17 * 4 + lVar38);
        local_6b0.p[lVar15 + lVar10 + lVar35 + lVar28] =
             ((double)iVar8 * local_6b0.p[lVar15 + lVar10 + lVar23 + lVar28] +
             (double)iVar29 * local_6b0.p[lVar16 + lVar35 + lVar28 + lVar10] +
             (double)iVar36 * local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar31 - lVar30)] +
             (double)iVar6 * local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar21 - lVar30)]) /
             (double)(iVar6 + iVar29 + iVar36 + iVar8);
        lVar10 = lVar21;
      }
      else {
        iVar36 = *(int *)((long)local_650.p + (lVar31 - lVar11) * 4 + lVar9);
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar9);
        iVar29 = *(int *)((long)local_650.p + lVar17 * 4 + lVar42);
        iVar8 = *(int *)((long)local_650.p + lVar17 * 4 + lVar1);
        local_6b0.p[lVar15 + lVar35 + lVar28 + (lVar10 - lVar30)] =
             ((double)iVar8 * local_6b0.p[lVar15 + lVar23 + lVar28 + (lVar21 - lVar30)] +
              (double)iVar29 * local_6b0.p[lVar15 + lVar23 + lVar28 + (lVar31 - lVar30)] +
              (double)iVar36 * local_6b0.p[lVar16 + lVar35 + lVar28 + (lVar31 - lVar30)] +
              (double)iVar6 * local_6b0.p[lVar16 + lVar35 + lVar28 + (lVar21 - lVar30)] +
             local_6b0.p[lVar16 + lVar23 + lVar28 + (lVar10 - lVar30)]) /
             (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
        lVar10 = lVar21;
      }
    }
    else {
      lVar10 = lVar10 + 1;
    }
  }
  lVar11 = (long)local_650.begin.x;
  lVar14 = (iVar22 - local_650.begin.y) * local_650.jstride;
  lVar12 = (iVar24 - local_650.begin.z) * local_650.kstride;
  lVar9 = lVar12 * 4 + (local_66c - local_650.begin.y) * local_650.jstride * 4;
  lVar15 = (int)(uVar32 - local_650.begin.z) * local_650.kstride;
  lVar30 = (long)local_6b0.begin.x;
  lVar16 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
  lVar23 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
  lVar35 = local_6b0.nstride * uVar7;
  lVar17 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
  lVar28 = (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride;
  lVar10 = local_5b0;
  while (lVar10 <= local_5b8) {
    lVar40 = lVar10 - lVar11;
    lVar38 = lVar40 * 4 + lVar14 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar38) == 0) {
      lVar31 = lVar10 + -1;
      lVar42 = (lVar31 - lVar11) * 4 + lVar14 * 4;
      iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar42);
      lVar21 = lVar10 + 1;
      lVar43 = lVar21 - lVar11;
      if (((iVar36 == 1) ||
          (lVar1 = lVar43 * 4 + lVar14 * 4, *(int *)((long)local_650.p + lVar12 * 4 + lVar1) == 1))
         || ((*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1 ||
             (*(int *)((long)local_650.p + lVar15 * 4 + lVar38) == 1)))) {
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar12 * 4 + lVar14 * 4);
        iVar29 = *(int *)((long)local_650.p + lVar40 * 4 + lVar9);
        lVar10 = lVar10 - lVar30;
        iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar38);
        local_6b0.p[lVar17 + lVar10 + lVar23 + lVar35] =
             ((double)iVar8 * local_6b0.p[lVar17 + lVar10 + lVar28 + lVar35] +
             (double)iVar29 * local_6b0.p[lVar16 + lVar23 + lVar35 + lVar10] +
             (double)iVar36 * local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar31 - lVar30)] +
             (double)iVar6 * local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar21 - lVar30)]) /
             (double)(iVar6 + iVar29 + iVar36 + iVar8);
        lVar10 = lVar21;
      }
      else {
        iVar36 = *(int *)((long)local_650.p + (lVar31 - lVar11) * 4 + lVar9);
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar9);
        iVar29 = *(int *)((long)local_650.p + lVar15 * 4 + lVar42);
        iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar1);
        local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar10 - lVar30)] =
             ((double)iVar8 * local_6b0.p[lVar17 + lVar28 + lVar35 + (lVar21 - lVar30)] +
              (double)iVar29 * local_6b0.p[lVar17 + lVar28 + lVar35 + (lVar31 - lVar30)] +
              (double)iVar36 * local_6b0.p[lVar16 + lVar23 + lVar35 + (lVar31 - lVar30)] +
              (double)iVar6 * local_6b0.p[lVar16 + lVar23 + lVar35 + (lVar21 - lVar30)] +
             local_6b0.p[lVar16 + lVar28 + lVar35 + (lVar10 - lVar30)]) /
             (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
        lVar10 = lVar21;
      }
    }
    else {
      lVar10 = lVar10 + 1;
    }
  }
  lVar11 = (long)local_650.begin.x;
  lVar14 = (iVar22 - local_650.begin.y) * local_650.jstride;
  lVar12 = (iVar19 - local_650.begin.z) * local_650.kstride;
  lVar9 = lVar12 * 4 + (local_66c - local_650.begin.y) * local_650.jstride * 4;
  lVar15 = (iVar18 - local_650.begin.z) * local_650.kstride;
  lVar30 = (long)local_6b0.begin.x;
  lVar16 = (local_66c - local_6b0.begin.y) * local_6b0.jstride;
  lVar23 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
  lVar35 = local_6b0.nstride * uVar7;
  lVar17 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
  lVar28 = (iVar18 - local_6b0.begin.z) * local_6b0.kstride;
  local_660 = local_6b0.p + lVar16 + lVar28 + lVar35;
  lVar10 = local_5b0;
  while (lVar10 <= local_5b8) {
    lVar40 = lVar10 - lVar11;
    lVar38 = lVar40 * 4 + lVar14 * 4;
    if (*(int *)((long)local_650.p + lVar12 * 4 + lVar38) == 0) {
      lVar31 = lVar10 + -1;
      lVar42 = (lVar31 - lVar11) * 4 + lVar14 * 4;
      iVar36 = *(int *)((long)local_650.p + lVar12 * 4 + lVar42);
      lVar21 = lVar10 + 1;
      lVar43 = lVar21 - lVar11;
      if ((((iVar36 == 1) ||
           (lVar1 = lVar43 * 4 + lVar14 * 4, *(int *)((long)local_650.p + lVar12 * 4 + lVar1) == 1))
          || (*(int *)((long)local_650.p + lVar40 * 4 + lVar9) == 1)) ||
         (*(int *)((long)local_650.p + lVar15 * 4 + lVar38) == 1)) {
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar12 * 4 + lVar14 * 4);
        iVar29 = *(int *)((long)local_650.p + lVar40 * 4 + lVar9);
        lVar10 = lVar10 - lVar30;
        iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar38);
        local_6b0.p[lVar17 + lVar10 + lVar23 + lVar35] =
             ((double)iVar8 * local_6b0.p[lVar17 + lVar10 + lVar28 + lVar35] +
             (double)iVar29 * local_6b0.p[lVar16 + lVar23 + lVar35 + lVar10] +
             (double)iVar36 * local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar31 - lVar30)] +
             (double)iVar6 * local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar21 - lVar30)]) /
             (double)(iVar6 + iVar29 + iVar36 + iVar8);
        lVar10 = lVar21;
      }
      else {
        iVar36 = *(int *)((long)local_650.p + (lVar31 - lVar11) * 4 + lVar9);
        iVar6 = *(int *)((long)local_650.p + lVar43 * 4 + lVar9);
        iVar29 = *(int *)((long)local_650.p + lVar15 * 4 + lVar42);
        iVar8 = *(int *)((long)local_650.p + lVar15 * 4 + lVar1);
        local_6b0.p[lVar17 + lVar23 + lVar35 + (lVar10 - lVar30)] =
             ((double)iVar8 * local_6b0.p[lVar17 + lVar28 + lVar35 + (lVar21 - lVar30)] +
              (double)iVar29 * local_6b0.p[lVar17 + lVar28 + lVar35 + (lVar31 - lVar30)] +
              (double)iVar36 * local_6b0.p[lVar16 + lVar23 + lVar35 + (lVar31 - lVar30)] +
              (double)iVar6 * local_6b0.p[lVar16 + lVar23 + lVar35 + (lVar21 - lVar30)] +
             local_660[lVar10 - lVar30]) / (double)(iVar8 + iVar36 + iVar6 + iVar29 + 1);
        lVar10 = lVar21;
      }
    }
    else {
      lVar10 = lVar10 + 1;
    }
  }
  pdVar26 = (double *)(ulong)uVar32;
  while (iVar36 = (int)pdVar26, iVar36 <= iVar18) {
    lVar10 = (long)local_650.begin.y;
    lVar12 = (iVar36 - local_650.begin.z) * local_650.kstride;
    uVar39 = iVar36 + 1;
    pdVar26 = (double *)(ulong)uVar39;
    lVar15 = (iVar36 - local_6b0.begin.z) * local_6b0.kstride;
    local_5e0 = local_6b0.nstride * uVar7;
    lVar14 = (long)(iVar13 - local_6b0.begin.x);
    lVar11 = (long)local_6b0.begin.y;
    local_660 = (double *)((long)local_650.p + lVar12 * 4 + (local_530 - local_650.begin.x) * 4);
    lVar9 = local_5a0;
    while (local_5f0 = pdVar26, lVar9 <= local_5d8) {
      lVar16 = (lVar9 - lVar10) * local_650.jstride * 4 + (local_530 - local_650.begin.x) * 4;
      if (*(int *)((long)local_650.p + lVar12 * 4 + lVar16) == 0) {
        lVar23 = (lVar9 - lVar11) * local_6b0.jstride;
        lVar17 = lVar9 + -1;
        iVar6 = *(int *)((long)local_660 + (lVar17 - lVar10) * local_650.jstride * 4);
        lVar9 = lVar9 + 1;
        iVar29 = *(int *)((long)local_660 + (lVar9 - lVar10) * local_650.jstride * 4);
        iVar8 = *(int *)((long)local_650.p +
                        ((iVar36 + -1) - local_650.begin.z) * local_650.kstride * 4 + lVar16);
        iVar2 = *(int *)((long)local_650.p +
                        (int)(uVar39 - local_650.begin.z) * local_650.kstride * 4 + lVar16);
        local_6b0.p[lVar23 + lVar14 + lVar15 + local_5e0] =
             ((double)iVar2 *
              local_6b0.p
              [lVar23 + lVar14 + (int)(uVar39 - local_6b0.begin.z) * local_6b0.kstride + local_5e0]
             + (double)iVar8 *
               local_6b0.p
               [lVar23 + lVar14 + ((iVar36 + -1) - local_6b0.begin.z) * local_6b0.kstride +
                                  local_5e0] +
               (double)iVar29 *
               local_6b0.p[lVar14 + lVar15 + local_5e0 + (lVar9 - lVar11) * local_6b0.jstride] +
               (double)iVar6 *
               local_6b0.p[lVar14 + lVar15 + local_5e0 + (lVar17 - lVar11) * local_6b0.jstride] +
               local_6b0.p[lVar23 + (long)(local_5cc - local_6b0.begin.x) + lVar15 + local_5e0]) /
             (double)(iVar2 + iVar6 + iVar29 + iVar8 + 1);
      }
      else {
        lVar9 = lVar9 + 1;
      }
    }
  }
  pdVar26 = (double *)(ulong)uVar32;
  while( true ) {
    local_610 = (long)local_6b0.begin.y;
    iVar36 = (int)pdVar26;
    uVar39 = uVar32;
    if (iVar18 < iVar36) break;
    lVar10 = (long)local_650.begin.y;
    lVar12 = (iVar36 - local_650.begin.z) * local_650.kstride;
    uVar39 = iVar36 + 1;
    pdVar26 = (double *)(ulong)uVar39;
    lVar15 = (iVar36 - local_6b0.begin.z) * local_6b0.kstride;
    local_5e0 = local_6b0.nstride * uVar7;
    lVar14 = (long)(local_604 - local_6b0.begin.x);
    lVar11 = (long)local_6b0.begin.y;
    local_660 = (double *)((long)local_650.p + lVar12 * 4 + (local_448 - local_650.begin.x) * 4);
    lVar9 = local_5a0;
    while (local_5f0 = pdVar26, lVar9 <= local_5d8) {
      lVar16 = (lVar9 - lVar10) * local_650.jstride * 4 + (local_448 - local_650.begin.x) * 4;
      if (*(int *)((long)local_650.p + lVar12 * 4 + lVar16) == 0) {
        lVar23 = (lVar9 - lVar11) * local_6b0.jstride;
        lVar17 = lVar9 + -1;
        iVar6 = *(int *)((long)local_660 + (lVar17 - lVar10) * local_650.jstride * 4);
        lVar9 = lVar9 + 1;
        iVar29 = *(int *)((long)local_660 + (lVar9 - lVar10) * local_650.jstride * 4);
        iVar8 = *(int *)((long)local_650.p +
                        ((iVar36 + -1) - local_650.begin.z) * local_650.kstride * 4 + lVar16);
        iVar2 = *(int *)((long)local_650.p +
                        (int)(uVar39 - local_650.begin.z) * local_650.kstride * 4 + lVar16);
        local_6b0.p[lVar23 + lVar14 + lVar15 + local_5e0] =
             ((double)iVar2 *
              local_6b0.p
              [lVar23 + lVar14 + (int)(uVar39 - local_6b0.begin.z) * local_6b0.kstride + local_5e0]
             + (double)iVar8 *
               local_6b0.p
               [lVar23 + lVar14 + ((iVar36 + -1) - local_6b0.begin.z) * local_6b0.kstride +
                                  local_5e0] +
               (double)iVar29 *
               local_6b0.p[lVar14 + lVar15 + local_5e0 + (lVar9 - lVar11) * local_6b0.jstride] +
               (double)iVar6 *
               local_6b0.p[lVar14 + lVar15 + local_5e0 + (lVar17 - lVar11) * local_6b0.jstride] +
               local_6b0.p[lVar23 + (long)(local_658 - local_6b0.begin.x) + lVar15 + local_5e0]) /
             (double)(iVar2 + iVar6 + iVar29 + iVar8 + 1);
      }
      else {
        lVar9 = lVar9 + 1;
      }
    }
  }
  while (uVar33 = uVar32, (int)uVar39 <= iVar18) {
    lVar11 = (long)local_650.begin.x;
    lVar12 = (local_528 - local_650.begin.y) * local_650.jstride;
    lVar15 = (int)(uVar39 - local_650.begin.z) * local_650.kstride;
    lVar9 = lVar15 * 4 + lVar12 * 4;
    lVar16 = (long)local_6b0.begin.x;
    lVar17 = (iVar27 - local_6b0.begin.y) * local_6b0.jstride;
    lVar23 = (int)(uVar39 - local_6b0.begin.z) * local_6b0.kstride;
    iVar36 = uVar39 - 1;
    uVar39 = uVar39 + 1;
    lVar14 = local_6b0.nstride * uVar7;
    lVar10 = local_5b0;
    while (lVar10 <= local_5b8) {
      lVar28 = (lVar10 - lVar11) * 4 + lVar12 * 4;
      if (*(int *)((long)local_650.p + lVar15 * 4 + lVar28) == 0) {
        iVar6 = *(int *)((long)local_650.p + ((lVar10 + -1) - lVar11) * 4 + lVar9);
        lVar30 = lVar10 + 1;
        iVar29 = *(int *)((long)local_650.p + (lVar30 - lVar11) * 4 + lVar9);
        lVar35 = lVar10 - lVar16;
        iVar8 = *(int *)((long)local_650.p +
                        (iVar36 - local_650.begin.z) * local_650.kstride * 4 + lVar28);
        iVar2 = *(int *)((long)local_650.p +
                        (int)(uVar39 - local_650.begin.z) * local_650.kstride * 4 + lVar28);
        local_6b0.p[lVar17 + lVar35 + lVar23 + lVar14] =
             ((double)iVar2 *
              local_6b0.p
              [lVar17 + lVar35 + (int)(uVar39 - local_6b0.begin.z) * local_6b0.kstride + lVar14] +
             (double)iVar8 *
             local_6b0.p
             [lVar17 + lVar35 + (iVar36 - local_6b0.begin.z) * local_6b0.kstride + lVar14] +
             (double)iVar6 * local_6b0.p[lVar17 + lVar23 + lVar14 + ((lVar10 + -1) - lVar16)] +
             (double)iVar29 * local_6b0.p[lVar17 + lVar23 + lVar14 + (lVar30 - lVar16)] +
             local_6b0.p
             [(iVar34 - local_6b0.begin.y) * local_6b0.jstride + lVar23 + lVar14 + lVar35]) /
             (double)(iVar6 + iVar29 + iVar8 + iVar2 + 1);
        lVar10 = lVar30;
      }
      else {
        lVar10 = lVar10 + 1;
      }
    }
  }
  while (iVar36 = iVar34, (int)uVar33 <= iVar18) {
    lVar11 = (long)local_650.begin.x;
    lVar12 = (local_5e8 - local_650.begin.y) * local_650.jstride;
    lVar15 = (int)(uVar33 - local_650.begin.z) * local_650.kstride;
    lVar9 = lVar15 * 4 + lVar12 * 4;
    lVar16 = (long)local_6b0.begin.x;
    lVar17 = (iVar22 - local_6b0.begin.y) * local_6b0.jstride;
    lVar23 = (int)(uVar33 - local_6b0.begin.z) * local_6b0.kstride;
    iVar36 = uVar33 - 1;
    uVar33 = uVar33 + 1;
    lVar14 = local_6b0.nstride * uVar7;
    lVar10 = local_5b0;
    while (lVar10 <= local_5b8) {
      lVar28 = (lVar10 - lVar11) * 4 + lVar12 * 4;
      if (*(int *)((long)local_650.p + lVar15 * 4 + lVar28) == 0) {
        iVar6 = *(int *)((long)local_650.p + ((lVar10 + -1) - lVar11) * 4 + lVar9);
        lVar30 = lVar10 + 1;
        iVar29 = *(int *)((long)local_650.p + (lVar30 - lVar11) * 4 + lVar9);
        lVar35 = lVar10 - lVar16;
        iVar8 = *(int *)((long)local_650.p +
                        (iVar36 - local_650.begin.z) * local_650.kstride * 4 + lVar28);
        iVar2 = *(int *)((long)local_650.p +
                        (int)(uVar33 - local_650.begin.z) * local_650.kstride * 4 + lVar28);
        local_6b0.p[lVar17 + lVar35 + lVar23 + lVar14] =
             ((double)iVar2 *
              local_6b0.p
              [lVar17 + lVar35 + (int)(uVar33 - local_6b0.begin.z) * local_6b0.kstride + lVar14] +
             (double)iVar8 *
             local_6b0.p
             [lVar17 + lVar35 + (iVar36 - local_6b0.begin.z) * local_6b0.kstride + lVar14] +
             (double)iVar6 * local_6b0.p[lVar17 + lVar23 + lVar14 + ((lVar10 + -1) - lVar16)] +
             (double)iVar29 * local_6b0.p[lVar17 + lVar23 + lVar14 + (lVar30 - lVar16)] +
             local_6b0.p
             [(local_66c - local_6b0.begin.y) * local_6b0.jstride + lVar23 + lVar14 + lVar35]) /
             (double)(iVar6 + iVar29 + iVar8 + iVar2 + 1);
        lVar10 = lVar30;
      }
      else {
        lVar10 = lVar10 + 1;
      }
    }
  }
  while (iVar6 = iVar34, iVar36 <= local_66c) {
    lVar11 = (long)local_650.begin.x;
    lVar17 = (local_520 - local_650.begin.z) * local_650.kstride;
    lVar9 = lVar17 * 4 + (iVar36 - local_650.begin.y) * local_650.jstride * 4;
    lVar15 = (long)local_6b0.begin.x;
    iVar6 = iVar36 - local_6b0.begin.y;
    iVar29 = iVar36 + -1;
    iVar36 = iVar36 + 1;
    lVar12 = iVar6 * local_6b0.jstride;
    lVar16 = (iVar24 - local_6b0.begin.z) * local_6b0.kstride;
    lVar14 = local_6b0.nstride * uVar7;
    lVar10 = local_5b0;
    while (lVar10 <= local_5b8) {
      lVar23 = lVar10 - lVar11;
      if (*(int *)((long)local_650.p + lVar23 * 4 + lVar9) == 0) {
        iVar6 = *(int *)((long)local_650.p + ((lVar10 + -1) - lVar11) * 4 + lVar9);
        lVar28 = lVar10 + 1;
        iVar8 = *(int *)((long)local_650.p + (lVar28 - lVar11) * 4 + lVar9);
        iVar2 = *(int *)((long)local_650.p +
                        lVar23 * 4 +
                        lVar17 * 4 + (iVar29 - local_650.begin.y) * local_650.jstride * 4);
        lVar30 = lVar10 - lVar15;
        iVar3 = *(int *)((long)local_650.p +
                        lVar23 * 4 +
                        lVar17 * 4 + (iVar36 - local_650.begin.y) * local_650.jstride * 4);
        local_6b0.p[lVar12 + lVar30 + lVar16 + lVar14] =
             ((double)iVar3 *
              local_6b0.p
              [(iVar36 - local_6b0.begin.y) * local_6b0.jstride + lVar16 + lVar14 + lVar30] +
              (double)iVar2 *
              local_6b0.p
              [(iVar29 - local_6b0.begin.y) * local_6b0.jstride + lVar16 + lVar14 + lVar30] +
              (double)iVar6 * local_6b0.p[lVar12 + lVar16 + lVar14 + ((lVar10 + -1) - lVar15)] +
              (double)iVar8 * local_6b0.p[lVar12 + lVar16 + lVar14 + (lVar28 - lVar15)] +
             local_6b0.p
             [lVar12 + lVar30 + (int)(uVar32 - local_6b0.begin.z) * local_6b0.kstride + lVar14]) /
             (double)(iVar6 + iVar8 + iVar2 + iVar3 + 1);
        lVar10 = lVar28;
      }
      else {
        lVar10 = lVar10 + 1;
      }
    }
  }
  while (iVar6 <= local_66c) {
    lVar11 = (long)local_650.begin.x;
    lVar17 = (local_5c0 - local_650.begin.z) * local_650.kstride;
    lVar9 = lVar17 * 4 + (iVar6 - local_650.begin.y) * local_650.jstride * 4;
    lVar15 = (long)local_6b0.begin.x;
    iVar36 = iVar6 - local_6b0.begin.y;
    iVar29 = iVar6 + -1;
    iVar6 = iVar6 + 1;
    lVar12 = iVar36 * local_6b0.jstride;
    lVar16 = (iVar19 - local_6b0.begin.z) * local_6b0.kstride;
    lVar14 = local_6b0.nstride * uVar7;
    lVar10 = local_5b0;
    while (lVar10 <= local_5b8) {
      lVar23 = lVar10 - lVar11;
      if (*(int *)((long)local_650.p + lVar23 * 4 + lVar9) == 0) {
        iVar36 = *(int *)((long)local_650.p + ((lVar10 + -1) - lVar11) * 4 + lVar9);
        lVar28 = lVar10 + 1;
        iVar8 = *(int *)((long)local_650.p + (lVar28 - lVar11) * 4 + lVar9);
        iVar2 = *(int *)((long)local_650.p +
                        lVar23 * 4 +
                        lVar17 * 4 + (iVar29 - local_650.begin.y) * local_650.jstride * 4);
        lVar30 = lVar10 - lVar15;
        iVar3 = *(int *)((long)local_650.p +
                        lVar23 * 4 +
                        lVar17 * 4 + (iVar6 - local_650.begin.y) * local_650.jstride * 4);
        local_6b0.p[lVar12 + lVar30 + lVar16 + lVar14] =
             ((double)iVar3 *
              local_6b0.p
              [(iVar6 - local_6b0.begin.y) * local_6b0.jstride + lVar16 + lVar14 + lVar30] +
              (double)iVar2 *
              local_6b0.p
              [(iVar29 - local_6b0.begin.y) * local_6b0.jstride + lVar16 + lVar14 + lVar30] +
              (double)iVar36 * local_6b0.p[lVar12 + lVar16 + lVar14 + ((lVar10 + -1) - lVar15)] +
              (double)iVar8 * local_6b0.p[lVar12 + lVar16 + lVar14 + (lVar28 - lVar15)] +
             local_6b0.p
             [lVar12 + lVar30 + (iVar18 - local_6b0.begin.z) * local_6b0.kstride + lVar14]) /
             (double)(iVar36 + iVar8 + iVar2 + iVar3 + 1);
        lVar10 = lVar28;
      }
      else {
        lVar10 = lVar10 + 1;
      }
    }
  }
  uVar7 = uVar7 + 1;
  local_5a8 = local_5a8 + 8;
  goto LAB_0048b026;
}

Assistant:

void FirstOrderExtrap (MultiFab& mf, const Geometry& geom, int scomp, int ncomp, int ngrow)
    {
        BL_ASSERT(mf.nGrow() >= ngrow);
        BL_ASSERT(scomp >= 0);
        BL_ASSERT((scomp+ncomp) <= mf.nComp());

        iMultiFab mask(mf.boxArray(), mf.DistributionMap(), 1, ngrow, MFInfo(),
                       DefaultFabFactory<IArrayBox>());
        mask.BuildMask(geom.Domain(), geom.periodicity(),
                       finebnd, crsebnd, physbnd, interior);

        // Do the extrap. on successive layers of ghost cells
        for (int layer = 0; layer < ngrow; layer++) {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(mf); mfi.isValid(); ++mfi)
            {
                const Box& bx        = mfi.validbox();
                const Box& gbx       = amrex::grow(bx,layer);
                auto const& mask_arr = mask.const_array(mfi);
                auto const& data_arr = mf.array(mfi,scomp);

                if (Gpu::inLaunchRegion()) {
                    // set the crse cell to zero in the current layer
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       if (!gbx.contains(i,j,k)) {
                           if (mask_arr(i,j,k) == crsebnd) data_arr(i,j,k,n) = 0.0;
                       }
                    });
                    ParallelFor(amrex::grow(gbx,1), ncomp,
                    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                    {
                       amrex_first_order_extrap_gpu(i, j, k, n, bx, mask_arr, data_arr);
                    });
                } else {
                    amrex_first_order_extrap_cpu(gbx, ncomp, mask_arr, data_arr);
                }
            }
        }
    }